

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

TValue * index2addr(lua_State *L,int idx)

{
  CallInfo *pCVar1;
  lua_CFunction p_Var2;
  int iVar3;
  lua_State *local_40;
  CClosure *func;
  TValue *o;
  CallInfo *ci;
  int idx_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  if (idx < 1) {
    if (idx < -0xf4627) {
      if (idx == -0xf4628) {
        L_local = (lua_State *)&L->l_G->l_registry;
      }
      else {
        iVar3 = -idx + -0xf4628;
        if (0x7e < iVar3) {
          __assert_fail("(idx <= 125 + 1) && \"upvalue index too large\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x51,"TValue *index2addr(lua_State *, int)");
        }
        if ((pCVar1->func->tt_ == 0x16) || ((pCVar1->func->tt_ & 0x7f) == 0x46)) {
          L_local = (lua_State *)&luaO_nilobject_;
        }
        else {
          if (pCVar1->func->tt_ != 0x8026) {
            __assert_fail("((((ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x55,"TValue *index2addr(lua_State *, int)");
          }
          if (((pCVar1->func->value_).gc)->tt != '&') {
            __assert_fail("(((ci->func)->value_).gc)->tt == ((6) | ((2) << 4))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x55,"TValue *index2addr(lua_State *, int)");
          }
          p_Var2 = (pCVar1->func->value_).f;
          if ((int)(uint)(byte)p_Var2[10] < iVar3) {
            local_40 = (lua_State *)&luaO_nilobject_;
          }
          else {
            local_40 = (lua_State *)(p_Var2 + (long)(-idx + -0xf4629) * 0x10 + 0x20);
          }
          L_local = local_40;
        }
      }
    }
    else {
      if ((idx == 0) || ((long)L->top - (long)(pCVar1->func + 1) >> 4 < (long)-idx)) {
        __assert_fail("(idx != 0 && -idx <= L->top - (ci->func + 1)) && \"invalid index\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x4a,"TValue *index2addr(lua_State *, int)");
      }
      L_local = (lua_State *)(L->top + idx);
    }
  }
  else {
    L_local = (lua_State *)(pCVar1->func + idx);
    if ((long)pCVar1->top - (long)(pCVar1->func + 1) >> 4 < (long)idx) {
      __assert_fail("(idx <= ci->top - (ci->func + 1)) && \"unacceptable index\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x45,"TValue *index2addr(lua_State *, int)");
    }
    if ((lua_State *)L->top <= L_local) {
      L_local = (lua_State *)&luaO_nilobject_;
    }
  }
  return (TValue *)L_local;
}

Assistant:

static TValue *index2addr (lua_State *L, int idx) {
  CallInfo *ci = L->ci;
  if (idx > 0) {
    TValue *o = ci->func + idx;
    api_check(L, idx <= ci->top - (ci->func + 1), "unacceptable index");
    if (o >= L->top) return NONVALIDVALUE;
    else return o;
  }
  else if (!ispseudo(idx)) {  /* negative index */
    api_check(L, idx != 0 && -idx <= L->top - (ci->func + 1), "invalid index");
    return L->top + idx;
  }
  else if (idx == LUA_REGISTRYINDEX)
    return &G(L)->l_registry;
  else {  /* upvalues */
    idx = LUA_REGISTRYINDEX - idx;
    api_check(L, idx <= MAXUPVAL + 1, "upvalue index too large");
    if (ttislcf(ci->func) || ttisfcf(ci->func))  /* light C function? */
      return NONVALIDVALUE;  /* it has no upvalues */
    else {
      CClosure *func = clCvalue(ci->func);
      return (idx <= func->nupvalues) ? &func->upvalue[idx-1] : NONVALIDVALUE;
    }
  }
}